

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

uint64_t secp256k1_testrand64(void)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t t;
  uint64_t result;
  
  uVar1 = rotl(secp256k1_test_state[0] + secp256k1_test_state[3],0x17);
  uVar1 = uVar1 + secp256k1_test_state[0];
  uVar2 = secp256k1_test_state[1] << 0x11;
  uVar3 = secp256k1_test_state[0] ^ secp256k1_test_state[2];
  secp256k1_test_state[3] = secp256k1_test_state[1] ^ secp256k1_test_state[3];
  secp256k1_test_state[1] = uVar3 ^ secp256k1_test_state[1];
  secp256k1_test_state[0] = secp256k1_test_state[3] ^ secp256k1_test_state[0];
  secp256k1_test_state[2] = uVar2 ^ uVar3;
  secp256k1_test_state[3] = rotl(secp256k1_test_state[3],0x2d);
  return uVar1;
}

Assistant:

SECP256K1_INLINE static uint64_t secp256k1_testrand64(void) {
    /* Test-only Xoshiro256++ RNG. See https://prng.di.unimi.it/ */
    const uint64_t result = rotl(secp256k1_test_state[0] + secp256k1_test_state[3], 23) + secp256k1_test_state[0];
    const uint64_t t = secp256k1_test_state[1] << 17;
    secp256k1_test_state[2] ^= secp256k1_test_state[0];
    secp256k1_test_state[3] ^= secp256k1_test_state[1];
    secp256k1_test_state[1] ^= secp256k1_test_state[2];
    secp256k1_test_state[0] ^= secp256k1_test_state[3];
    secp256k1_test_state[2] ^= t;
    secp256k1_test_state[3] = rotl(secp256k1_test_state[3], 45);
    return result;
}